

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int __thiscall ACSStringPool::AddString(ACSStringPool *this,FString *str)

{
  DWORD h_00;
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  int i;
  uint bucketnum;
  uint h;
  FString *str_local;
  ACSStringPool *this_local;
  
  pcVar2 = FString::GetChars(str);
  sVar3 = FString::Len(str);
  h_00 = SuperFastHash(pcVar2,sVar3);
  pcVar2 = FString::operator_cast_to_char_(str);
  sVar3 = FString::Len(str);
  uVar1 = FindString(this,pcVar2,sVar3,h_00,h_00 % 0xfb);
  if ((int)uVar1 < 0) {
    this_local._4_4_ = InsertString(this,str,h_00,h_00 % 0xfb);
  }
  else {
    this_local._4_4_ = uVar1 | 0x7ff00000;
  }
  return this_local._4_4_;
}

Assistant:

int ACSStringPool::AddString(FString &str)
{
	unsigned int h = SuperFastHash(str.GetChars(), str.Len());
	unsigned int bucketnum = h % NUM_BUCKETS;
	int i = FindString(str, str.Len(), h, bucketnum);
	if (i >= 0)
	{
		return i | STRPOOL_LIBRARYID_OR;
	}
	return InsertString(str, h, bucketnum);
}